

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

bool __thiscall cmCTestP4::LoadRevisions(cmCTestP4 *this)

{
  pointer pcVar1;
  cmCTest *this_00;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  pointer __x;
  string range;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p4_changes;
  OutputLogger errDescribe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p4_describe;
  OutputLogger err;
  ChangesParser out;
  ostringstream cmCTestLog_msg;
  value_type local_988;
  string local_968;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_948;
  pointer local_930;
  string local_928;
  OutputLogger local_908;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c8;
  OutputLogger local_8b0;
  ChangesParser local_870;
  undefined1 local_5f8 [608];
  char *local_398;
  char *local_168;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> local_150;
  Revision local_130;
  
  local_948.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_948.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_948.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetP4Options(this,&local_948);
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_988,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length
            );
  std::__cxx11::string::append((char *)&local_988);
  iVar2 = std::__cxx11::string::compare((char *)&(this->super_cmCTestGlobalVC).OldRevision);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&(this->super_cmCTestGlobalVC).NewRevision);
    if (iVar2 != 0) {
      pcVar3 = (char *)std::__cxx11::string::append((char *)&local_988);
      pcVar3 = (char *)std::__cxx11::string::_M_append
                                 (pcVar3,(ulong)(this->super_cmCTestGlobalVC).OldRevision.
                                                _M_dataplus._M_p);
      pcVar3 = (char *)std::__cxx11::string::append(pcVar3);
      std::__cxx11::string::_M_append
                (pcVar3,(ulong)(this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[8]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_948,
                 (char (*) [8])"changes");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_948,&local_988);
      ChangesParser::ChangesParser(&local_870,this,"p4_changes-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                (&local_8b0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_changes-err> ");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&this->ChangeLists,
                        (this->ChangeLists).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      local_928._M_string_length = 0;
      local_928.field_2._M_local_buf[0] = '\0';
      local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
      cmCTestVC::RunChild((cmCTestVC *)this,&local_948,(OutputParser *)&local_870,
                          (OutputParser *)&local_8b0,&local_928,Auto);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_928._M_dataplus._M_p != &local_928.field_2) {
        operator_delete(local_928._M_dataplus._M_p,
                        CONCAT71(local_928.field_2._M_allocated_capacity._1_7_,
                                 local_928.field_2._M_local_buf[0]) + 1);
      }
      local_930 = (this->ChangeLists).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      __x = (this->ChangeLists).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      if (local_930 != __x) {
        local_8c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_8c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_8c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        do {
          SetP4Options(this,&local_8c8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[9]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_8c8
                     ,(char (*) [9])"describe");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[3]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_8c8
                     ,(char (*) [3])"-s");
          __x = __x + -1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_8c8,__x);
          DescribeParser::DescribeParser((DescribeParser *)local_5f8,this,"p4_describe-out> ");
          cmProcessTools::OutputLogger::OutputLogger
                    (&local_908,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                     "p4_describe-err> ");
          local_968._M_string_length = 0;
          local_968.field_2._M_local_buf[0] = '\0';
          local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
          cmCTestVC::RunChild((cmCTestVC *)this,&local_8c8,(OutputParser *)local_5f8,
                              (OutputParser *)&local_908,&local_968,Auto);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_968._M_dataplus._M_p != &local_968.field_2) {
            operator_delete(local_968._M_dataplus._M_p,
                            CONCAT71(local_968.field_2._M_allocated_capacity._1_7_,
                                     local_968.field_2._M_local_buf[0]) + 1);
          }
          local_908.super_LineParser.super_OutputParser._vptr_OutputParser =
               (_func_int **)&PTR__LineParser_00b3d268;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_908.super_LineParser.Line._M_dataplus._M_p !=
              &local_908.super_LineParser.Line.field_2) {
            operator_delete(local_908.super_LineParser.Line._M_dataplus._M_p,
                            local_908.super_LineParser.Line.field_2._M_allocated_capacity + 1);
          }
          local_5f8._0_8_ = &PTR__DescribeParser_00b39bd0;
          cmCTestVC::Revision::~Revision(&local_130);
          std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector
                    (&local_150);
          if (local_168 != (char *)0x0) {
            operator_delete__(local_168);
          }
          if (local_398 != (char *)0x0) {
            operator_delete__(local_398);
          }
          local_5f8._0_8_ = &PTR__LineParser_00b3d268;
          if ((undefined1 *)local_5f8._24_8_ != local_5f8 + 0x28) {
            operator_delete((void *)local_5f8._24_8_,local_5f8._40_8_ + 1);
          }
        } while (__x != local_930);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_8c8);
      }
      local_8b0.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)&PTR__LineParser_00b3d268;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8b0.super_LineParser.Line._M_dataplus._M_p !=
          &local_8b0.super_LineParser.Line.field_2) {
        operator_delete(local_8b0.super_LineParser.Line._M_dataplus._M_p,
                        local_8b0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
      }
      local_870.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)&PTR__ChangesParser_00b39b88;
      if (local_870.RegexIdentify.program != (char *)0x0) {
        operator_delete__(local_870.RegexIdentify.program);
      }
      local_870.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)&PTR__LineParser_00b3d268;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_870.super_LineParser.Line._M_dataplus._M_p !=
          &local_870.super_LineParser.Line.field_2) {
        operator_delete(local_870.super_LineParser.Line._M_dataplus._M_p,
                        local_870.super_LineParser.Line.field_2._M_allocated_capacity + 1);
      }
      bVar4 = true;
      goto LAB_0023a8d6;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5f8,"   At least one of the revisions ",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5f8,"is unknown. No repository changes will be reported.\n",0x34);
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestP4.cxx"
               ,0x18d,(char *)local_870.super_LineParser.super_OutputParser._vptr_OutputParser,false
              );
  if (local_870.super_LineParser.super_OutputParser._vptr_OutputParser !=
      (_func_int **)&local_870.super_LineParser.Prefix) {
    operator_delete(local_870.super_LineParser.super_OutputParser._vptr_OutputParser,
                    (ulong)(local_870.super_LineParser.Prefix + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
  std::ios_base::~ios_base((ios_base *)(local_5f8 + 0x70));
  bVar4 = false;
LAB_0023a8d6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_948);
  return bVar4;
}

Assistant:

bool cmCTestP4::LoadRevisions()
{
  std::vector<std::string> p4_changes;
  this->SetP4Options(p4_changes);

  // Use 'p4 changes ...@old,new' to get a list of changelists
  std::string range = this->SourceDirectory + "/...";

  // If any revision is unknown it means we couldn't contact the server.
  // Do not process updates
  if (this->OldRevision == "<unknown>" || this->NewRevision == "<unknown>") {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   At least one of the revisions "
                 << "is unknown. No repository changes will be reported.\n");
    return false;
  }

  range.append("@")
    .append(this->OldRevision)
    .append(",")
    .append(this->NewRevision);

  p4_changes.emplace_back("changes");
  p4_changes.push_back(range);

  ChangesParser out(this, "p4_changes-out> ");
  OutputLogger err(this->Log, "p4_changes-err> ");

  this->ChangeLists.clear();
  this->RunChild(p4_changes, &out, &err);

  if (this->ChangeLists.empty()) {
    return true;
  }

  // p4 describe -s ...@1111111,2222222
  std::vector<std::string> p4_describe;
  for (std::string const& i : cmReverseRange(this->ChangeLists)) {
    this->SetP4Options(p4_describe);
    p4_describe.emplace_back("describe");
    p4_describe.emplace_back("-s");
    p4_describe.push_back(i);

    DescribeParser outDescribe(this, "p4_describe-out> ");
    OutputLogger errDescribe(this->Log, "p4_describe-err> ");
    this->RunChild(p4_describe, &outDescribe, &errDescribe);
  }
  return true;
}